

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O3

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenCapability(Lexer *this)

{
  Token *this_00;
  TokenType type;
  Lexer *in_RSI;
  Token *last;
  Position local_30;
  
  nextChar(in_RSI);
  if (in_RSI->currentChar == 0x21) {
    nextChar(in_RSI);
    getCurrentCursor(&local_30,in_RSI);
    this_00 = (Token *)operator_new(0x30);
    last = in_RSI->currentToken;
    type = TOK_ENSURE;
  }
  else {
    getCurrentCursor(&local_30,in_RSI);
    this_00 = (Token *)operator_new(0x30);
    last = in_RSI->currentToken;
    type = TOK_DIRECTIVE;
  }
  Token::Token(this_00,last,type,&local_30);
  this->_vptr_Lexer = (_func_int **)this_00;
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenCapability() noexcept {
  nextChar(); // eat #
  if (currentChar == '!') {
    nextChar(); // eat !
    return std::make_unique<Token>(currentToken,
        TokenType::TOK_ENSURE, getCurrentCursor());
  }

  return std::make_unique<Token>(currentToken,
      TokenType::TOK_DIRECTIVE, getCurrentCursor());
}